

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void subr_copytimestats(LispPTR *args)

{
  LispPTR *__src;
  LispPTR *__dest;
  MISCSTATS *dest;
  MISCSTATS *source;
  LispPTR *args_local;
  
  __src = NativeAligned4FromLAddr(*args);
  __dest = NativeAligned4FromLAddr(args[1]);
  update_miscstats();
  memcpy(__dest,__src,0x7c);
  return;
}

Assistant:

void subr_copytimestats(LispPTR args[])
{
  MISCSTATS *source;
  MISCSTATS *dest;
  source = (MISCSTATS *)NativeAligned4FromLAddr(args[0]);
  dest = (MISCSTATS *)NativeAligned4FromLAddr(args[1]);
  update_miscstats();
  *dest = *source;
}